

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O1

void __thiscall NeuralNetwork::backPropagation(NeuralNetwork *this,VectorXf *y)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  pointer pLVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  _func_float_float *p_Var12;
  non_const_type pMVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uVar20;
  uint uVar21;
  LhsNested pMVar22;
  RhsNested RVar23;
  Index size;
  char *pcVar24;
  Index index;
  ulong uVar25;
  non_const_type pMVar26;
  long lVar27;
  long lVar28;
  NeuralNetwork *pNVar29;
  uint uVar30;
  ActualDstType actualDst;
  VectorXf temp1;
  VectorXf temp;
  assign_op<float,_float> local_b1;
  NeuralNetwork *local_b0;
  uint local_a4;
  Product<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_0>
  local_a0;
  Product<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_0>
  local_90;
  Product<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_0>
  local_80;
  Matrix<float,__1,__1,_0,__1,__1> local_70;
  undefined4 local_54;
  VectorXf *local_48;
  _func_float_float *local_40;
  
  pLVar7 = (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar25 = pLVar7[-1].output.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
           .m_rows;
  local_b0 = this;
  if ((y->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows != uVar25)
  {
    pcVar24 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::Matrix<float, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::Matrix<float, -1, 1>, Rhs = const Eigen::Matrix<float, -1, 1>]"
    ;
LAB_00107035:
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar24);
  }
  pfVar8 = (y->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pfVar9 = pLVar7[-1].output.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
           .m_data;
  if (pLVar7[-1].loss.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar25) {
    if ((long)uVar25 < 0) goto LAB_0010703f;
    Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
              ((DenseStorage<float,__1,__1,_1,_0> *)&pLVar7[-1].loss,uVar25,uVar25,1);
  }
  pNVar29 = local_b0;
  uVar10 = pLVar7[-1].loss.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if (uVar10 == uVar25) {
    pfVar11 = pLVar7[-1].loss.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    uVar25 = uVar10 + 3;
    if (-1 < (long)uVar10) {
      uVar25 = uVar10;
    }
    uVar25 = uVar25 & 0xfffffffffffffffc;
    if (3 < (long)uVar10) {
      lVar27 = 0;
      do {
        pfVar1 = pfVar8 + lVar27;
        fVar14 = pfVar1[1];
        fVar15 = pfVar1[2];
        fVar16 = pfVar1[3];
        pfVar2 = pfVar9 + lVar27;
        fVar17 = pfVar2[1];
        fVar18 = pfVar2[2];
        fVar19 = pfVar2[3];
        pfVar3 = pfVar11 + lVar27;
        *pfVar3 = *pfVar1 - *pfVar2;
        pfVar3[1] = fVar14 - fVar17;
        pfVar3[2] = fVar15 - fVar18;
        pfVar3[3] = fVar16 - fVar19;
        lVar27 = lVar27 + 4;
      } while (lVar27 < (long)uVar25);
    }
    if ((long)uVar25 < (long)uVar10) {
      do {
        pfVar11[uVar25] = pfVar8[uVar25] - pfVar9[uVar25];
        uVar25 = uVar25 + 1;
      } while (uVar10 != uVar25);
    }
    pLVar7 = (local_b0->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_finish;
    p_Var12 = (_func_float_float *)
              pLVar7[-1].loss.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
    if ((long)p_Var12 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = const Eigen::Matrix<float, -1, 1>]"
                   );
    }
    if (p_Var12 !=
        (_func_float_float *)
        pLVar7[-1].output.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows) {
      pcVar24 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::ArrayWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::ArrayWrapper<const Eigen::CwiseUnaryOp<float (*)(float), const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::ArrayWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Rhs = const Eigen::ArrayWrapper<const Eigen::CwiseUnaryOp<float (*)(float), const Eigen::Matrix<float, -1, 1>>>]"
      ;
      goto LAB_00107035;
    }
    local_48 = &pLVar7[-1].output;
    local_70.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         (Index)&pLVar7[-1].loss;
    local_40 = local_b0->deriveActivateFunc_;
    local_54 = 0xc0000000;
    local_70.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)p_Var12;
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const>const>const,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<float(*)(float),Eigen::Matrix<float,_1,1,0,_1,1>const>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_80,
               (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                *)&local_70);
    RVar23.m_matrix = local_80.m_rhs.m_matrix;
    pMVar22 = local_80.m_lhs;
    pLVar7 = (pNVar29->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((non_const_type)
        pLVar7[-1].biasGrads.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
        .m_rows != local_80.m_rhs.m_matrix) {
      if ((long)local_80.m_rhs.m_matrix < 0) {
LAB_0010703f:
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
                     );
      }
      Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                ((DenseStorage<float,__1,__1,_1,_0> *)&pLVar7[-1].biasGrads,
                 (Index)local_80.m_rhs.m_matrix,(Index)local_80.m_rhs.m_matrix,1);
    }
    pNVar29 = local_b0;
    pMVar13 = (non_const_type)
              pLVar7[-1].biasGrads.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
    if (pMVar13 == RVar23.m_matrix) {
      pfVar8 = pLVar7[-1].biasGrads.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pMVar26 = (non_const_type)
                ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data + 3);
      if (-1 < (long)pMVar13) {
        pMVar26 = pMVar13;
      }
      pMVar26 = (non_const_type)((ulong)pMVar26 & 0xfffffffffffffffc);
      if (3 < (long)pMVar13) {
        lVar27 = 0;
        do {
          puVar4 = (undefined8 *)
                   ((long)&(pMVar22->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data + lVar27 * 4);
          uVar20 = puVar4[1];
          pfVar9 = pfVar8 + lVar27;
          *(undefined8 *)pfVar9 = *puVar4;
          *(undefined8 *)(pfVar9 + 2) = uVar20;
          lVar27 = lVar27 + 4;
        } while (lVar27 < (long)pMVar26);
      }
      if ((long)pMVar26 < (long)pMVar13) {
        do {
          pfVar8[(long)pMVar26] =
               *(float *)((long)&(pMVar22->
                                 super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                                 m_storage.m_data + (long)pMVar26 * 4);
          pMVar26 = (non_const_type)
                    ((long)&(pMVar26->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>)
                            .m_storage.m_data + 1);
        } while (pMVar13 != pMVar26);
      }
      iVar6 = local_b0->layerCount_;
      pLVar7 = (local_b0->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a0.m_rhs.m_matrix = &pLVar7[(long)iVar6 + -2].output;
      local_a0.m_lhs = (LhsNested)&local_80;
      Eigen::Matrix<float,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<float,_1,1,0,_1,1>>,0>>
                ((Matrix<float,_1,_1,0,_1,_1> *)&local_70,&local_a0);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::internal::assign_op<float,float>>
                (&pLVar7[(long)iVar6 + -2].weightGrads,&local_70,
                 (assign_op<float,_float> *)&local_90);
      free(local_70.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
          );
      lVar27 = (long)pNVar29->layerCount_;
      pLVar7 = (pNVar29->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(non_const_type *)
           ((long)&pLVar7[lVar27 + -2].weights.
                   super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage + 8) !=
          local_80.m_rhs.m_matrix) {
LAB_0010705e:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Eigen::Matrix<float, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Matrix<float, -1, 1>, Option = 0]"
                     );
      }
      local_70.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (float *)&pLVar7[lVar27 + -2].weights;
      local_70.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (Index)&local_80;
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<float,float>>
                (&pLVar7[lVar27 + -2].loss,
                 (Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>
                  *)&local_70,(assign_op<float,_float> *)&local_a0,(type)0x0);
      if (2 < pNVar29->layerCount_) {
        uVar30 = pNVar29->layerCount_ - 3;
        do {
          pLVar7 = (pNVar29->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_a4 = uVar30;
          if (*(Index *)((long)&pLVar7[(ulong)uVar30 + 1].loss.
                                super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                m_storage + 8) !=
              *(Index *)((long)&pLVar7[(ulong)uVar30 + 1].output.
                                super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                                m_storage + 8)) {
            pcVar24 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::ArrayWrapper<Eigen::Matrix<float, -1, 1>>, const Eigen::ArrayWrapper<const Eigen::CwiseUnaryOp<float (*)(float), const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::ArrayWrapper<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::ArrayWrapper<const Eigen::CwiseUnaryOp<float (*)(float), const Eigen::Matrix<float, -1, 1>>>]"
            ;
            goto LAB_00107035;
          }
          local_70.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows
               = (Index)&pLVar7[(ulong)uVar30 + 1].output;
          local_70.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
               = (float *)&pLVar7[(ulong)uVar30 + 1].loss;
          local_70.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols
               = (Index)pNVar29->deriveActivateFunc_;
          Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<float(*)(float),Eigen::Matrix<float,_1,1,0,_1,1>const>const>const>const>>
                    ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_a0,
                     (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                      *)&local_70);
          RVar23.m_matrix = local_a0.m_rhs.m_matrix;
          pMVar22 = local_a0.m_lhs;
          if (*(non_const_type *)
               ((long)&pLVar7[(ulong)uVar30 + 1].biasGrads.
                       super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage + 8)
              != local_a0.m_rhs.m_matrix) {
            if ((long)local_a0.m_rhs.m_matrix < 0) goto LAB_0010703f;
            Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                      ((DenseStorage<float,__1,__1,_1,_0> *)&pLVar7[(ulong)uVar30 + 1].biasGrads,
                       (Index)local_a0.m_rhs.m_matrix,(Index)local_a0.m_rhs.m_matrix,1);
          }
          pNVar29 = local_b0;
          pMVar13 = *(non_const_type *)
                     ((long)&pLVar7[(ulong)uVar30 + 1].biasGrads.
                             super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
                     + 8);
          if (pMVar13 != RVar23.m_matrix) goto LAB_00107001;
          lVar27 = (long)pLVar7[(ulong)uVar30 + 1].biasGrads.
                         super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
          pMVar26 = (non_const_type)
                    ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>)
                            .m_storage.m_data + 3);
          if (-1 < (long)pMVar13) {
            pMVar26 = pMVar13;
          }
          pMVar26 = (non_const_type)((ulong)pMVar26 & 0xfffffffffffffffc);
          if (3 < (long)pMVar13) {
            lVar28 = 0;
            do {
              puVar4 = (undefined8 *)
                       ((long)&pMVar22->
                               super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> +
                       lVar28 * 4);
              uVar20 = puVar4[1];
              puVar5 = (undefined8 *)(lVar27 + lVar28 * 4);
              *puVar5 = *puVar4;
              puVar5[1] = uVar20;
              lVar28 = lVar28 + 4;
            } while (lVar28 < (long)pMVar26);
          }
          if ((long)pMVar26 < (long)pMVar13) {
            do {
              *(undefined4 *)(lVar27 + (long)pMVar26 * 4) =
                   *(undefined4 *)
                    ((long)&pMVar22->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> +
                    (long)pMVar26 * 4);
              pMVar26 = (non_const_type)
                        ((long)&(pMVar26->
                                super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                                m_storage.m_data + 1);
            } while (pMVar13 != pMVar26);
          }
          local_90.m_rhs.m_matrix = &pLVar7[uVar30].output;
          local_90.m_lhs = (LhsNested)&local_a0;
          Eigen::Matrix<float,-1,-1,0,-1,-1>::
          Matrix<Eigen::Product<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<float,_1,1,0,_1,1>>,0>>
                    ((Matrix<float,_1,_1,0,_1,_1> *)&local_70,&local_90);
          uVar21 = local_a4;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::internal::assign_op<float,float>>
                    (&pLVar7[uVar30].weightGrads,&local_70,&local_b1);
          free(local_70.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          if (uVar21 != 0) {
            if (*(non_const_type *)
                 ((long)&pLVar7[uVar30].weights.
                         super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage +
                 8) != local_a0.m_rhs.m_matrix) goto LAB_0010705e;
            local_70.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = (float *)&pLVar7[uVar30].weights;
            local_70.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = (Index)&local_a0;
            Eigen::internal::
            call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<float,float>>
                      (&pLVar7[uVar30].loss,
                       (Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>
                        *)&local_70,(assign_op<float,_float> *)&local_90,(type)0x0);
          }
          free(local_a0.m_lhs);
          uVar30 = uVar21 - 1;
        } while (0 < (int)uVar21);
      }
      free(local_80.m_lhs);
      return;
    }
LAB_00107001:
    pcVar24 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::Matrix<float, -1, 1>, T1 = float, T2 = float]"
    ;
  }
  else {
    pcVar24 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::Matrix<float, -1, 1>>, T1 = float, T2 = float]"
    ;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar24);
}

Assistant:

void NeuralNetwork::backPropagation(const Eigen::VectorXf& y) {
    using namespace std;
    using namespace Eigen;
    this->layers_.back().loss = (y - this->layers_.back().output);
    VectorXf& lastOutput = this->layers_.back().output;  //输出层的输出
    // temp就是损失对输出层偏置的梯度，同时，在求损失对权重的偏导，和损失对上一层输出的偏导时，也要乘以这个
    Eigen::VectorXf temp = ((this->layers_.back().loss * (-2)).array() *
                            (lastOutput.unaryExpr(this->deriveActivateFunc_).array()))
                               .matrix();
    // cout << temp.rows() << endl;

    this->layers_.back().biasGrads = temp;
    this->layers_[layerCount_ - 2].weightGrads =
        temp * (this->layers_[layerCount_ - 2].output.transpose());
    this->layers_[layerCount_ - 2].loss = this->layers_[layerCount_ - 2].weights.transpose() * temp;
    for (int i = layerCount_ - 3; i >= 0; --i) {
        auto& layer = this->layers_[i];
        auto& nextLayer = this->layers_[i + 1];
        Eigen::VectorXf temp1 = ((nextLayer.loss).array() *
                                 (nextLayer.output.unaryExpr(this->deriveActivateFunc_).array()))
                                    .matrix();
        nextLayer.biasGrads = temp1;
        layer.weightGrads = temp1 * (layer.output.transpose());
        if (i != 0)
            layer.loss = layer.weights.transpose() * temp1;
    }
}